

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffBinary(NodeDiffComputer *this,BinExpr *lhs,BinExpr *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = diffNodes(this,&lhs->_lhs->super_Node,&rhs->_lhs->super_Node);
  if (iVar1 <= this->limit) {
    iVar2 = diffNodes(this,&lhs->_rhs->super_Node,&rhs->_rhs->super_Node);
    if (this->limit < iVar2) {
      iVar1 = 0;
    }
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

int32_t diffBinary(const BinExpr *lhs, const BinExpr *rhs) {
    assert(lhs->op() == rhs->op());

    int32_t diffLeft = diffNodes(lhs->lhs(), rhs->lhs());

    if (diffLeft > limit)
      return diffLeft;

    int32_t diffRight = diffNodes(lhs->rhs(), rhs->rhs());

    if (diffRight > limit)
      return diffRight;

    return diffLeft + diffRight;
  }